

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O1

int Abc_NtkCollapseReduce(Vec_Str_t *vSop,Vec_Int_t *vSupp,Vec_Int_t *vClass,Vec_Wec_t *vSupps)

{
  char *pcVar1;
  uint uVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  uint uVar6;
  uint uVar7;
  void *__s;
  int iVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  char *pcVar16;
  
  if (vSop->nSize == 4) {
    if (vClass->nSize < 1) {
      return 1;
    }
    piVar3 = vClass->pArray;
    lVar9 = 0;
    while( true ) {
      iVar8 = piVar3[lVar9];
      if (((long)iVar8 < 0) || (vSupps->nSize <= iVar8)) break;
      vSupps->pArray[iVar8].nSize = 0;
      lVar9 = lVar9 + 1;
      if (vClass->nSize <= lVar9) {
        return 1;
      }
    }
LAB_002a189a:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  uVar2 = vSupp->nSize;
  uVar15 = (ulong)uVar2;
  pcVar16 = vSop->pArray;
  uVar7 = 0x10;
  if (0xe < uVar2 - 1) {
    uVar7 = uVar2;
  }
  if (uVar7 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar7 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)(int)uVar2 * 4);
  }
  if (*pcVar16 != '\0') {
    lVar9 = (long)(int)uVar2 + 3;
    pcVar10 = pcVar16;
    do {
      if (0 < (int)uVar2) {
        uVar11 = 0;
        do {
          if (pcVar10[uVar11] != '-') {
            *(undefined4 *)((long)__s + uVar11 * 4) = 1;
          }
          uVar11 = uVar11 + 1;
        } while (uVar15 != uVar11);
      }
      pcVar1 = pcVar10 + lVar9;
      pcVar10 = pcVar10 + lVar9;
    } while (*pcVar1 != '\0');
  }
  if (0 < (int)uVar2) {
    uVar11 = 0;
    iVar8 = 0;
    do {
      iVar8 = iVar8 + (uint)(*(int *)((long)__s + uVar11 * 4) == 0);
      uVar11 = uVar11 + 1;
    } while (uVar15 != uVar11);
    if (iVar8 != 0) {
      if (*pcVar16 == '\0') {
        uVar7 = 0;
      }
      else {
        uVar6 = uVar2 + 3;
        uVar11 = 1;
        if (1 < (int)uVar6) {
          uVar11 = (ulong)uVar6;
        }
        uVar7 = 0;
        do {
          uVar12 = 0;
          do {
            if ((uVar15 <= uVar12) || (*(int *)((long)__s + uVar12 * 4) != 0)) {
              if (((int)uVar7 < 0) || (vSop->nSize <= (int)uVar7)) goto LAB_002a183d;
              uVar14 = (ulong)uVar7;
              uVar7 = uVar7 + 1;
              vSop->pArray[uVar14] = pcVar16[uVar12];
            }
            uVar12 = uVar12 + 1;
          } while (uVar11 != uVar12);
          pcVar10 = pcVar16 + (int)uVar6;
          pcVar16 = pcVar16 + (int)uVar6;
        } while (*pcVar10 != '\0');
      }
      if (((int)uVar7 < 0) || (vSop->nSize <= (int)uVar7)) {
LAB_002a183d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
      }
      vSop->pArray[uVar7] = '\0';
      if (vSop->nSize <= (int)uVar7) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x20a,"void Vec_StrShrink(Vec_Str_t *, int)");
      }
      vSop->nSize = uVar7 + 1;
      if (0 < vClass->nSize) {
        piVar3 = vClass->pArray;
        lVar9 = 0;
        do {
          lVar13 = (long)piVar3[lVar9];
          if ((lVar13 < 0) || (vSupps->nSize <= piVar3[lVar9])) goto LAB_002a189a;
          pVVar4 = vSupps->pArray;
          uVar7 = pVVar4[lVar13].nSize;
          uVar15 = (ulong)uVar7;
          if ((int)uVar7 < 1) {
            uVar6 = 0;
          }
          else {
            piVar5 = pVVar4[lVar13].pArray;
            uVar11 = 0;
            uVar6 = 0;
            do {
              if (uVar2 == uVar11) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              if (*(int *)((long)__s + uVar11 * 4) != 0) {
                if (((int)uVar6 < 0) || ((int)uVar15 <= (int)uVar6)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                }
                uVar15 = (ulong)uVar6;
                uVar6 = uVar6 + 1;
                piVar5[uVar15] = piVar5[uVar11];
              }
              uVar11 = uVar11 + 1;
              uVar7 = pVVar4[lVar13].nSize;
              uVar15 = (ulong)(int)uVar7;
            } while ((long)uVar11 < (long)uVar15);
          }
          if ((int)uVar7 < (int)uVar6) {
            __assert_fail("p->nSize >= nSizeNew",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
          }
          pVVar4[lVar13].nSize = uVar6;
          lVar9 = lVar9 + 1;
        } while (lVar9 < vClass->nSize);
      }
      iVar8 = 1;
      goto LAB_002a181f;
    }
  }
  iVar8 = 0;
LAB_002a181f:
  if (__s != (void *)0x0) {
    free(__s);
  }
  return iVar8;
}

Assistant:

int Abc_NtkCollapseReduce( Vec_Str_t * vSop, Vec_Int_t * vSupp, Vec_Int_t * vClass, Vec_Wec_t * vSupps )
{
    int j = 0, i, k, iCo, iVar, nVars = Vec_IntSize(vSupp);
    char * pCube, * pSop = Vec_StrArray(vSop);
    Vec_Int_t * vPres;
    if ( Vec_StrSize(vSop) == 4 ) // constant
    {
        Vec_IntForEachEntry( vClass, iCo, i )
            Vec_IntClear( Vec_WecEntry(vSupps, iCo) );
        return 1;
    }
    vPres = Vec_IntStart( nVars );
    Abc_NtkSopForEachCube( pSop, nVars, pCube )
        for ( k = 0; k < nVars; k++ )
            if ( pCube[k] != '-' )
                Vec_IntWriteEntry( vPres, k, 1 );
    if ( Vec_IntCountZero(vPres) == 0 )
    {
        Vec_IntFree( vPres );
        return 0;
    }
    // reduce cubes
    Abc_NtkSopForEachCube( pSop, nVars, pCube )
        for ( k = 0; k < nVars + 3; k++ )
            if ( k >= nVars || Vec_IntEntry(vPres, k) )
                Vec_StrWriteEntry( vSop, j++, pCube[k] );
    Vec_StrWriteEntry( vSop, j++, '\0' );
    Vec_StrShrink( vSop, j );
    // reduce support
    Vec_IntForEachEntry( vClass, iCo, i )
    {
        j = 0;
        vSupp = Vec_WecEntry( vSupps, iCo );
        Vec_IntForEachEntry( vSupp, iVar, k )
            if ( Vec_IntEntry(vPres, k) )
                Vec_IntWriteEntry( vSupp, j++, iVar );
        Vec_IntShrink( vSupp, j );
    }
    Vec_IntFree( vPres );
//    if ( Vec_IntSize(vSupp) != Abc_SopGetVarNum(Vec_StrArray(vSop)) )
//        printf( "Mismatch!!!\n" );
    return 1;
}